

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_gate.c
# Opt level: O0

void gate_release(gate *g)

{
  skynet_context *ctx_00;
  connection *c;
  skynet_context *ctx;
  int i;
  gate *g_local;
  
  ctx_00 = g->ctx;
  for (ctx._4_4_ = 0; ctx._4_4_ < g->max_connection; ctx._4_4_ = ctx._4_4_ + 1) {
    if (-1 < g->conn[ctx._4_4_].id) {
      skynet_socket_close(ctx_00,g->conn[ctx._4_4_].id);
    }
  }
  if (-1 < g->listen_id) {
    skynet_socket_close(ctx_00,g->listen_id);
  }
  messagepool_free(&g->mp);
  hashid_clear(&g->hash);
  free(g->conn);
  free(g);
  return;
}

Assistant:

void
gate_release(struct gate *g) {
	int i;
	struct skynet_context *ctx = g->ctx;
	for (i=0;i<g->max_connection;i++) {
		struct connection *c = &g->conn[i];
		if (c->id >=0) {
			skynet_socket_close(ctx, c->id);
		}
	}
	if (g->listen_id >= 0) {
		skynet_socket_close(ctx, g->listen_id);
	}
	messagepool_free(&g->mp);
	hashid_clear(&g->hash);
	skynet_free(g->conn);
	skynet_free(g);
}